

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utils.c
# Opt level: O0

void read_data_crc(FILE *fp,DataCrc *crc)

{
  uint uVar1;
  uint local_20;
  uint local_1c;
  RK_S32 ret;
  RK_U32 loop;
  DataCrc *crc_local;
  FILE *fp_local;
  
  if (fp != (FILE *)0x0) {
    local_20 = __isoc99_fscanf(fp,"%8d",crc);
    for (local_1c = 0; local_1c < crc->sum_cnt; local_1c = local_1c + 1) {
      uVar1 = __isoc99_fscanf(fp,"%lx",crc->sum + local_1c);
      local_20 = uVar1 | local_20;
    }
    uVar1 = __isoc99_fscanf(fp,"%08x",&crc->vor);
    if ((uVar1 | local_20) == 0xffffffff) {
      _mpp_log_l(2,"utils","unexpected EOF found\n","read_data_crc");
    }
  }
  return;
}

Assistant:

void read_data_crc(FILE *fp, DataCrc *crc)
{
    RK_U32 loop = 0;

    if (fp) {
        RK_S32 ret = 0;
        ret = fscanf(fp, "%8d", &crc->len);
        for (loop = 0; loop < crc->sum_cnt; loop++) {
            ret |= fscanf(fp, "%lx", &crc->sum[loop]);
        }
        ret |= fscanf(fp, "%08x", &crc->vor);
        if (ret == EOF)
            mpp_err_f("unexpected EOF found\n");
    }
}